

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
opengv::math::Sturm::findRoots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Sturm *this)

{
  MatrixXd *pMVar1;
  double dVar2;
  ulong uVar3;
  pointer pdVar4;
  undefined8 *puVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  MatrixXd monomials;
  MatrixXd value;
  MatrixXd derivative;
  assign_op<double,_double> local_d1;
  vector<double,_std::allocator<double>_> *local_d0;
  DenseStorage<double,__1,__1,__1,_0> local_c8;
  DenseStorage<double,__1,__1,__1,_0> local_a8;
  SrcXprType local_88;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = __return_storage_ptr__;
  bracketRoots(this,__return_storage_ptr__,-1.0);
  local_c8.m_data = (double *)0x0;
  local_c8.m_rows = 0;
  local_c8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_c8,this->_dimension,this->_dimension,1);
  local_c8.m_data[this->_dimension - 1] = 1.0;
  if ((local_d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    pMVar1 = &this->_C;
    uVar9 = 0;
    do {
      lVar8 = 0;
      do {
        uVar3 = this->_dimension;
        if (1 < uVar3) {
          pdVar4 = (local_d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar6 = uVar3 + 1;
          if (uVar6 < 4) {
            uVar6 = 3;
          }
          dVar2 = local_c8.m_data[uVar3 - 1];
          lVar7 = -2;
          do {
            dVar2 = dVar2 * pdVar4[uVar9];
            local_c8.m_data[uVar3 + lVar7] = dVar2;
            lVar7 = lVar7 + -1;
          } while (-lVar7 != uVar6);
        }
        local_88.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
        m_data = (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        local_88.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
        m_cols.m_value =
             (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
        local_88.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        m_startRow.m_value = 0;
        local_88.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        m_startCol.m_value = 0;
        local_88.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        m_outerStride = 1;
        local_88.m_rhs = (RhsNested)&local_c8;
        local_a8.m_data = (double *)0x0;
        local_a8.m_rows = 0;
        local_a8.m_cols = 0;
        local_88.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.m_xpr =
             pMVar1;
        if ((local_c8.m_cols != 0) &&
           (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_c8.m_cols),0)
            < 1)) {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = acos;
          __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  (&local_a8,local_c8.m_cols,1,local_c8.m_cols);
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_a8,&local_88,
              (assign_op<double,_double> *)&local_48);
        local_88.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
        m_cols.m_value =
             (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
        local_88.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
        m_data = (this->_C).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data + 1;
        local_88.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        m_startRow.m_value = 1;
        local_88.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        m_startCol.m_value = 0;
        local_88.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        m_outerStride = 1;
        local_88.m_rhs = (RhsNested)&local_c8;
        local_48.m_data = (double *)0x0;
        local_48.m_rows = 0;
        local_48.m_cols = 0;
        if ((local_c8.m_cols != 0) &&
           (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_c8.m_cols),0)
            < 1)) {
          local_88.m_lhs.
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.m_xpr
               = pMVar1;
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = acos;
          __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        local_88.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.m_xpr =
             pMVar1;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  (&local_48,local_c8.m_cols,1,local_c8.m_cols);
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_48,&local_88,&local_d1);
        pdVar4 = (local_d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4[uVar9] = pdVar4[uVar9] - *local_a8.m_data / *local_48.m_data;
        free((void *)local_48.m_data[-1]);
        if (local_a8.m_data != (double *)0x0) {
          free((void *)local_a8.m_data[-1]);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 5);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)((long)(local_d0->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_d0->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (local_c8.m_data != (double *)0x0) {
    free((void *)local_c8.m_data[-1]);
  }
  return local_d0;
}

Assistant:

std::vector<double>
opengv::math::Sturm::findRoots()
{
  //bracket the roots
  std::vector<double> roots;
  bracketRoots(roots);

  //pollish
  Eigen::MatrixXd monomials(_dimension,1);
  monomials(_dimension-1,0) = 1.0;

  for(size_t r = 0; r < roots.size(); r++ )
  {
    //Now do Gauss iterations here
    //evaluate all monomials at the left bound
    for(size_t k = 0; k < 5; k++ )
    {
      for(size_t i = 2; i <= _dimension; i++)
        monomials(_dimension-i,0) = monomials(_dimension-i+1,0)*roots[r];

      Eigen::MatrixXd value = _C.row(0) * monomials;
      Eigen::MatrixXd derivative = _C.row(1) * monomials;

      //correction
      roots[r] = roots[r] - (value(0,0)/derivative(0,0));
    }
  }

  return roots;
}